

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParsePre(TidyDocImpl *doc,Node *pre,GetTokenMode mode)

{
  Dict *pDVar1;
  Dict *pDVar2;
  Bool BVar3;
  Node *pNVar4;
  TidyTagId tid;
  TidyParserMemory memory;
  
  if (pre == (Node *)0x0) {
    prvTidypopMemory(doc);
    pre = memory.original_node;
  }
  else {
    memory.reentry_node = (Node *)0x0;
    memory.reentry_state = 0;
    if ((pre->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  prvTidyInlineDup(doc,(Node *)0x0);
LAB_0013ae88:
  do {
    while (memory.reentry_state != 0) {
      if (memory.reentry_state == 1) {
        pNVar4 = prvTidyInferredTag(doc,TidyTag_PRE);
        memory.reentry_state = 0;
        prvTidyReport(doc,pre,pNVar4,0x247);
        prvTidyInsertNodeAfterElement(memory.reentry_node,pNVar4);
        pre = pNVar4;
      }
      else if (memory.reentry_state == 2) {
        prvTidyReport(doc,pre,memory.reentry_node,0x25a);
        return (Node *)0x0;
      }
    }
    pNVar4 = prvTidyGetToken(doc,Preformatted);
    memory.reentry_state = 2;
    memory.reentry_node = (Node *)0x0;
  } while (pNVar4 == (Node *)0x0);
  memory.reentry_node = pNVar4;
  if (pNVar4->type == EndTag) {
    pDVar1 = pNVar4->tag;
    pDVar2 = pre->tag;
    if (pDVar1 != pDVar2) {
      if (pDVar1 == (Dict *)0x0) {
        tid = TidyTag_UNKNOWN;
      }
      else {
        tid = pDVar1->id;
      }
      BVar3 = DescendantOf(pre,tid);
      if (BVar3 == no) goto LAB_0013af56;
    }
    if ((pDVar1 == (Dict *)0x0) || ((pDVar1->id | TidyTag_DT) != TidyTag_HTML)) {
      if (pDVar1 == pDVar2) {
        prvTidyFreeNode(doc,pNVar4);
      }
      else {
        prvTidyReport(doc,pre,pNVar4,0x259);
        prvTidyUngetToken(doc);
      }
      pre->closed = yes;
LAB_0013b0cb:
      TrimSpaces(doc,pre);
      return (Node *)0x0;
    }
  }
  else {
LAB_0013af56:
    BVar3 = prvTidynodeIsText(pNVar4);
    if (BVar3 != no) {
      prvTidyInsertNodeAtEnd(pre,pNVar4);
      memory.reentry_state = 0;
      goto LAB_0013ae88;
    }
    BVar3 = InsertMisc(pre,pNVar4);
    memory.reentry_state = 0;
    if (BVar3 != no) goto LAB_0013ae88;
    if (pNVar4->tag == (Dict *)0x0) goto LAB_0013af2f;
    if (pNVar4->tag->id == TidyTag_P) {
LAB_0013af91:
      if (pNVar4->type == StartTag) {
        memory.reentry_state = 0;
        prvTidyReport(doc,pre,pNVar4,0x28e);
        TrimSpaces(doc,pre);
        prvTidyCoerceNode(doc,pNVar4,TidyTag_BR,no,no);
        prvTidyFreeAttrs(doc,pNVar4);
        prvTidyInsertNodeAtEnd(pre,pNVar4);
        goto LAB_0013ae88;
      }
    }
    else {
      BVar3 = prvTidynodeIsText(pNVar4);
      if ((BVar3 == no) &&
         (((pNVar4->tag == (Dict *)0x0 || (pNVar4->tag->id == TidyTag_PARAM)) ||
          (BVar3 = prvTidynodeHasCM(pNVar4,0x100010), BVar3 == no)))) {
        if (pNVar4->type != EndTag) {
          BVar3 = prvTidynodeHasCM(pNVar4,0x280);
          if ((BVar3 != no) || ((pNVar4->tag != (Dict *)0x0 && (pNVar4->tag->id == TidyTag_TABLE))))
          {
            if (doc->lexer->exiled == no) {
              prvTidyReport(doc,pre,pNVar4,0x259);
            }
            prvTidyUngetToken(doc);
            return (Node *)0x0;
          }
          prvTidyInsertNodeAfterElement(pre,pNVar4);
          prvTidyReport(doc,pre,pNVar4,0x259);
          memory.reentry_mode = IgnoreWhitespace;
          memory.reentry_state = 1;
LAB_0013b133:
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT3248(CONCAT824(memory._24_8_,
                                                   CONCAT816(pNVar4,CONCAT88(pre,prvTidyParsePre))))
                           );
          return pNVar4;
        }
        if ((doc->lexer->exiled != no) &&
           ((BVar3 = prvTidynodeHasCM(pNVar4,0x80), BVar3 != no ||
            ((pNVar4->tag != (Dict *)0x0 && (pNVar4->tag->id == TidyTag_TABLE)))))) {
          prvTidyUngetToken(doc);
          goto LAB_0013b0cb;
        }
      }
      else {
        if ((pNVar4->tag != (Dict *)0x0) && (pNVar4->tag->id == TidyTag_P)) goto LAB_0013af91;
        BVar3 = prvTidynodeIsElement(pNVar4);
        if (BVar3 != no) {
          if ((pNVar4->tag != (Dict *)0x0) && (pNVar4->tag->id == TidyTag_BR)) {
            TrimSpaces(doc,pre);
          }
          prvTidyInsertNodeAtEnd(pre,pNVar4);
          memory.reentry_mode = IgnoreWhitespace;
          memory.reentry_state = 0;
          goto LAB_0013b133;
        }
      }
    }
  }
LAB_0013af2f:
  memory.reentry_state = 0;
  prvTidyReport(doc,pre,pNVar4,0x235);
  prvTidyFreeNode(doc,pNVar4);
  goto LAB_0013ae88;
}

Assistant:

Node* TY_(ParsePre)( TidyDocImpl* doc, Node *pre, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_RENTRY_ACTION,          /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;


    if ( pre == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        pre = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(pre);
        if (pre->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }

    TY_(InlineDup)( doc, NULL ); /* tell lexer to insert inlines if needed */

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)(doc, Preformatted);
        
        switch ( state )
        {
            case STATE_INITIAL:
            {
                if ( node == NULL )
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if ( node->type == EndTag &&
                     (node->tag == pre->tag || DescendantOf(pre, TagId(node))) )
                {
                    if (nodeIsBODY(node) || nodeIsHTML(node))
                    {
                        TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)(doc, node);
                        continue;
                    }
                    if (node->tag == pre->tag)
                    {
                        TY_(FreeNode)(doc, node);
                    }
                    else
                    {
                        TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE );
                        TY_(UngetToken)( doc );
                    }
                    pre->closed = yes;
                    TrimSpaces(doc, pre);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if (TY_(nodeIsText)(node))
                {
                    TY_(InsertNodeAtEnd)(pre, node);
                    continue;
                }

                /* deal with comments etc. */
                if (InsertMisc(pre, node))
                    continue;

                if (node->tag == NULL)
                {
                    TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)(doc, node);
                    continue;
                }

                /* strip unexpected tags */
                if ( !PreContent(doc, node) )
                {
                    /* fix for http://tidy.sf.net/bug/772205 */
                    if (node->type == EndTag)
                    {
                        /* http://tidy.sf.net/issue/1590220 */
                       if ( doc->lexer->exiled
                           && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                       {
                          TY_(UngetToken)(doc);
                          TrimSpaces(doc, pre);
                           DEBUG_LOG_EXIT;
                          return NULL;
                       }

                       TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                       TY_(FreeNode)(doc, node);
                       continue;
                    }
                    /* http://tidy.sf.net/issue/1590220 */
                    else if (TY_(nodeHasCM)(node, CM_TABLE|CM_ROW)
                             || nodeIsTABLE(node) )
                    {
                        if (!doc->lexer->exiled)
                            /* No missing close warning if exiled. */
                            TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);

                        TY_(UngetToken)(doc);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /*
                      This is basically what Tidy 04 August 2000 did and far more accurate
                      with respect to browser behaivour than the code commented out above.
                      Tidy could try to propagate the <pre> into each disallowed child where
                      <pre> is allowed in order to replicate some browsers behaivour, but
                      there are a lot of exceptions, e.g. Internet Explorer does not propagate
                      <pre> into table cells while Mozilla does. Opera 6 never propagates
                      <pre> into blocklevel elements while Opera 7 behaves much like Mozilla.

                      Tidy behaves thus mostly like Opera 6 except for nested <pre> elements
                      which are handled like Mozilla takes them (Opera6 closes all <pre> after
                      the first </pre>).

                      There are similar issues like replacing <p> in <pre> with <br>, for
                      example

                        <pre>...<p>...</pre>                 (Input)
                        <pre>...<br>...</pre>                (Tidy)
                        <pre>...<br>...</pre>                (Opera 7 and Internet Explorer)
                        <pre>...<br><br>...</pre>            (Opera 6 and Mozilla)

                        <pre>...<p>...</p>...</pre>          (Input)
                        <pre>...<br>......</pre>             (Tidy, BUG!)
                        <pre>...<br>...<br>...</pre>         (Internet Explorer)
                        <pre>...<br><br>...<br><br>...</pre> (Mozilla, Opera 6)
                        <pre>...<br>...<br><br>...</pre>     (Opera 7)

                      or something similar, they could also be closing the <pre> and propagate
                      the <pre> into the newly opened <p>.

                      Todo: IMG, OBJECT, APPLET, BIG, SMALL, SUB, SUP, FONT, and BASEFONT are
                      disallowed in <pre>, Tidy neither detects this nor does it perform any
                      cleanup operation. Tidy should at least issue a warning if it encounters
                      such constructs.

                      Todo: discarding </p> is abviously a bug, it should be replaced by <br>.
                    */
                    TY_(InsertNodeAfterElement)(pre, node);
                    TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);
                    
                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParsePre);
                        memory.original_node = pre;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_RENTRY_ACTION;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                if ( nodeIsP(node) )
                {
                    if (node->type == StartTag)
                    {
                        TY_(Report)(doc, pre, node, USING_BR_INPLACE_OF);

                        /* trim white space before <p> in <pre>*/
                        TrimSpaces(doc, pre);

                        /* coerce both <p> and </p> to <br> */
                        TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                        TY_(FreeAttrs)( doc, node ); /* discard align attribute etc. */
                        TY_(InsertNodeAtEnd)( pre, node );
                    }
                    else
                    {
                        TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                    }
                    continue;
                }

                if ( TY_(nodeIsElement)(node) )
                {
                    /* trim white space before <br> */
                    if ( nodeIsBR(node) )
                        TrimSpaces(doc, pre);

                    TY_(InsertNodeAtEnd)(pre, node);
                    
                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParsePre);
                        memory.original_node = pre;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_INITIAL;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                /* discard unexpected tags */
                TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            } break;
                
            case STATE_RENTRY_ACTION:
            {
                Node* newnode = TY_(InferredTag)(doc, TidyTag_PRE);
                TY_(Report)(doc, pre, newnode, INSERTING_TAG);
                pre = newnode;
                TY_(InsertNodeAfterElement)(node, pre);
                state = STATE_INITIAL;
                continue;
            } break;
            
            default:
                break;

        } /* switch */
    } /* while */

    TY_(Report)(doc, pre, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}